

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::RE2(RE2 *this,string *pattern)

{
  StringPiece *in_RDI;
  Options *in_stack_00000450;
  StringPiece *in_stack_00000458;
  RE2 *in_stack_00000460;
  string *str;
  Options local_48 [3];
  
  Options::Options((Options *)&in_RDI->size_);
  str = (string *)&in_RDI[4].size_;
  std::__cxx11::string::string((string *)str);
  std::once_flag::once_flag((once_flag *)&in_RDI[8].size_);
  std::once_flag::once_flag((once_flag *)((long)&in_RDI[8].size_ + 4));
  std::once_flag::once_flag((once_flag *)(in_RDI + 9));
  StringPiece::StringPiece(in_RDI,str);
  Options::Options(local_48,DefaultOptions);
  Init(in_stack_00000460,in_stack_00000458,in_stack_00000450);
  return;
}

Assistant:

RE2::RE2(const std::string& pattern) {
  Init(pattern, DefaultOptions);
}